

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

char * next_boundary(char *startp,char *endp,char *b,size_t blen,int need_crlf)

{
  int iVar1;
  char *pcVar2;
  char *__s1;
  ulong uVar3;
  
  if (startp + blen + 2 <= endp) {
    __s1 = startp + 2;
    uVar3 = 0;
    do {
      if (((__s1[-2] == '-') && (__s1[-1] == '-')) && (iVar1 = bcmp(__s1,b,blen), iVar1 == 0)) {
        if (need_crlf == 0) {
          return __s1;
        }
        if (((1 < uVar3) && (__s1[-4] == '\r')) && (__s1[-3] == '\n')) {
          return __s1;
        }
      }
      uVar3 = uVar3 + 1;
      pcVar2 = __s1 + blen + 1;
      __s1 = __s1 + 1;
    } while (pcVar2 <= endp);
  }
  return (char *)0x0;
}

Assistant:

static const char *next_boundary(const char *startp, const char *endp,
                                 const char *b, size_t blen, int need_crlf)
{
    /* scan for the next boundary */
    for (const char *p = startp ; p + 2 + blen <= endp ; ++p)
    {
        /* check for a match */
        if (p[0] != '-' || p[1] != '-' || memcmp(p+2, b, blen) != 0)
            continue;

        /* if we need a newline prefix, check that it's there */
        if (need_crlf && (p < startp + 2 || p[-2] != '\r' || p[-1] != '\n'))
            continue;

        /* it's a match - return the part after the '--' prefix */
        return p + 2;
    }

    /* didn't find it */
    return 0;
}